

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O1

bool amrex::anon_unknown_12::is<amrex::Box>(string *str,Box *val)

{
  char cVar1;
  bool bVar2;
  string left;
  istringstream s;
  undefined1 *local_1b0;
  long local_1a8;
  undefined1 local_1a0;
  undefined7 uStack_19f;
  long local_190 [4];
  byte abStack_170 [88];
  ios_base local_118 [264];
  
  std::__cxx11::istringstream::istringstream((istringstream *)local_190,(string *)str,_S_in);
  amrex::operator>>((istream *)local_190,val);
  if ((abStack_170[*(long *)(local_190[0] + -0x18)] & 5) == 0) {
    local_1a8 = 0;
    local_1a0 = 0;
    local_1b0 = &local_1a0;
    cVar1 = std::ios::widen((char)(istringstream *)local_190 +
                            (char)*(undefined8 *)(local_190[0] + -0x18));
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_190,(string *)&local_1b0,cVar1);
    bVar2 = local_1a8 == 0;
    if (local_1b0 != &local_1a0) {
      operator_delete(local_1b0,CONCAT71(uStack_19f,local_1a0) + 1);
    }
  }
  else {
    bVar2 = false;
  }
  std::__cxx11::istringstream::~istringstream((istringstream *)local_190);
  std::ios_base::~ios_base(local_118);
  return bVar2;
}

Assistant:

bool
is (const std::string& str, T& val)
{
    std::istringstream s(str);
    s >> val;
    if ( s.fail() ) return false;
    std::string left;
    std::getline(s, left);
    if ( !left.empty() ) return false;
    return true;
}